

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O1

void __thiscall
slang::ast::ConversionExpression::checkImplicitConversions
          (ConversionExpression *this,ASTContext *context,Type *sourceType,Type *targetType,
          Expression *op,Expression *parentExpr,SourceRange operatorRange,
          ConversionKind conversionKind)

{
  SymbolKind SVar1;
  Type *this_00;
  Type *this_01;
  SourceRange sourceRange;
  bool bVar2;
  bool bVar3;
  bitwidth_t bVar4;
  EffectiveSign EVar5;
  bitwidth_t bVar6;
  Expression *pEVar7;
  Type *pTVar8;
  Diagnostic *pDVar9;
  optional<unsigned_int> oVar10;
  InstanceSymbolBase *pIVar11;
  uint uVar12;
  DiagCode code;
  SourceRange range;
  anon_class_24_3_d0f3c930 addDiag;
  anon_class_24_3_d0f3c930 local_70;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  char local_38;
  
  local_70.operatorRange = &operatorRange;
  local_70.context = (ASTContext *)this;
  local_70.op = (Expression *)targetType;
  pEVar7 = Expression::unwrapImplicitConversions((Expression *)targetType);
  if (pEVar7->kind == LValueReference) {
    return;
  }
  if ((pEVar7->kind == BinaryOp) &&
     (pEVar7 = Expression::unwrapImplicitConversions(*(Expression **)(pEVar7 + 1)),
     pEVar7->kind == LValueReference)) {
    return;
  }
  if (sourceType->canonical == (Type *)0x0) {
    Type::resolveCanonical(sourceType);
  }
  this_00 = sourceType->canonical;
  if (*(long *)&context[1].lookupIndex == 0) {
    Type::resolveCanonical((Type *)context);
  }
  this_01 = *(Type **)&context[1].lookupIndex;
  bVar2 = Type::isIntegral(this_00);
  if ((bVar2) && (bVar2 = Type::isIntegral(this_01), bVar2)) {
    SVar1 = (this_00->super_Symbol).kind;
    if ((((PackedUnionType < SVar1) || ((0x140400U >> (SVar1 & UntypedType) & 1) == 0)) ||
        (SVar1 = (this_01->super_Symbol).kind, PackedUnionType < SVar1)) ||
       (((0x140400U >> (SVar1 & UntypedType) & 1) == 0 ||
        (bVar2 = Type::isMatching(this_00,this_01), bVar2)))) {
      if ((this_00->super_Symbol).kind == PackedArrayType) {
        pTVar8 = Type::getArrayElementType(this_00);
        bVar4 = Type::getBitWidth(pTVar8);
        if ((1 < bVar4) && ((this_01->super_Symbol).kind == PackedArrayType)) {
          pTVar8 = Type::getArrayElementType(this_01);
          bVar4 = Type::getBitWidth(pTVar8);
          if (((1 < bVar4) &&
              ((pTVar8 = this_01, bVar2 = anon_unknown.dwarf_17dc63a::hasSameDims(this_00,this_01),
               !bVar2 && (bVar2 = checkImplicitConversions::anon_class_1_0_00000001::operator()
                                            ((anon_class_1_0_00000001 *)targetType,
                                             (Expression *)pTVar8), !bVar2)))) &&
             ((op == (Expression *)0x0 ||
              (((op->kind != BinaryOp ||
                (bVar2 = OpInfo::isComparison(*(BinaryOperator *)&op[1].constant), !bVar2)) ||
               (bVar2 = checkImplicitConversions::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)op[1].type.ptr,(Expression *)pTVar8),
               !bVar2)))))) {
            pDVar9 = checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
                               (&local_70,(DiagCode)0xcd0007);
            pDVar9 = ast::operator<<(pDVar9,(Type *)context);
            ast::operator<<(pDVar9,sourceType);
          }
        }
      }
      ASTContext::tryEval((ConstantValue *)&local_58,(ASTContext *)this,(Expression *)targetType);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_58);
      if (local_38 != '\0') {
        return;
      }
      bVar2 = Type::isSigned(this_00);
      bVar3 = Type::isSigned(this_01);
      if ((bVar2 != bVar3) &&
         ((((op == (Expression *)0x0 || (op->kind != BinaryOp)) ||
           (bVar2 = OpInfo::isComparison(*(BinaryOperator *)&op[1].constant), !bVar2)) &&
          (EVar5 = Expression::getEffectiveSign((Expression *)targetType,false), EVar5 != Either))))
      {
        pDVar9 = checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
                           (&local_70,(DiagCode)0xd40007);
        pDVar9 = ast::operator<<(pDVar9,(Type *)context);
        ast::operator<<(pDVar9,sourceType);
      }
      if ((int)parentExpr == 1) {
        return;
      }
      bVar4 = Type::getBitWidth(this_00);
      bVar6 = Type::getBitWidth(this_01);
      if (bVar4 == bVar6) {
        return;
      }
      oVar10 = Expression::getEffectiveWidth((Expression *)targetType);
      if (((ulong)oVar10.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
        return;
      }
      if (bVar4 <= bVar6 &&
          oVar10.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload <= bVar4) {
        return;
      }
      pIVar11 = ASTContext::getInstance((ASTContext *)this);
      uVar12 = 0xce0007;
      if (pIVar11 == (InstanceSymbolBase *)0x0) {
        uVar12 = 0xda0007;
      }
      pDVar9 = checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
                         (&local_70,
                          (DiagCode)
                          (uVar12 | (uint)(bVar4 < oVar10.
                                                  super__Optional_base<unsigned_int,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<unsigned_int>.
                                                  _M_payload) << 0x10));
      local_58._0_8_ = ZEXT48(bVar6);
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar9->args,(unsigned_long *)&local_58);
      local_58._0_8_ = ZEXT48(bVar4);
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar9->args,(unsigned_long *)&local_58);
      return;
    }
    bVar2 = anon_unknown.dwarf_17dc63a::isSameStructUnion(this_00,this_01);
    if (bVar2) {
      return;
    }
    bVar2 = anon_unknown.dwarf_17dc63a::isUnionMemberType(this_00,this_01);
    if (bVar2) {
      return;
    }
    pDVar9 = checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
                       (&local_70,(DiagCode)0xc30007);
  }
  else {
    bVar2 = Type::isNumeric(this_00);
    if (!bVar2) {
      return;
    }
    bVar2 = Type::isNumeric(this_01);
    if (!bVar2) {
      return;
    }
    ASTContext::tryEval((ConstantValue *)&local_58,(ASTContext *)this,(Expression *)targetType);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_58);
    if (local_38 != '\0') {
      return;
    }
    bVar2 = Type::isIntegral(this_00);
    code.subsystem = Expressions;
    code.code = 0xbf;
    if (!bVar2) {
      bVar2 = Type::isIntegral(this_01);
      code.subsystem = Expressions;
      code.code = 199;
      if (!bVar2) {
        bVar4 = Type::getBitWidth(this_00);
        bVar6 = Type::getBitWidth(this_01);
        code.subsystem = Expressions;
        code.code = 0xc0;
        if (bVar6 <= bVar4) {
          bVar4 = Type::getBitWidth(this_00);
          bVar6 = Type::getBitWidth(this_01);
          code.subsystem = Expressions;
          code.code = 0xc1;
          if (bVar4 <= bVar6) {
            return;
          }
        }
      }
    }
    sourceRange.startLoc = (SourceLocation)(targetType->super_Symbol).parentScope;
    sourceRange.endLoc = (SourceLocation)(targetType->super_Symbol).nextInScope;
    pDVar9 = ASTContext::addDiag((ASTContext *)this,code,sourceRange);
    if (((ulong)operatorRange.startLoc & 0xfffffff) != 0) {
      range.endLoc = operatorRange.endLoc;
      range.startLoc = operatorRange.startLoc;
      Diagnostic::operator<<(pDVar9,range);
    }
  }
  pDVar9 = ast::operator<<(pDVar9,(Type *)context);
  ast::operator<<(pDVar9,sourceType);
  return;
}

Assistant:

void ConversionExpression::checkImplicitConversions(
    const ASTContext& context, const Type& sourceType, const Type& targetType, const Expression& op,
    const Expression* parentExpr, SourceRange operatorRange, ConversionKind conversionKind) {

    auto isStructUnionEnum = [](const Type& t) {
        return t.kind == SymbolKind::PackedStructType || t.kind == SymbolKind::PackedUnionType ||
               t.kind == SymbolKind::EnumType;
    };

    auto isMultiDimArray = [](const Type& t) {
        return t.kind == SymbolKind::PackedArrayType && t.getArrayElementType()->getBitWidth() > 1;
    };

    auto parentIsComparison = [&] {
        return parentExpr && parentExpr->kind == ExpressionKind::BinaryOp &&
               OpInfo::isComparison(parentExpr->as<BinaryExpression>().op);
    };

    auto addDiag = [&](DiagCode code) -> Diagnostic& {
        auto& diag = context.addDiag(code, op.sourceRange);
        if (operatorRange.start())
            diag << operatorRange;
        return diag;
    };

    // Don't warn about conversions in compound assignment operators.
    auto isCompoundAssign = [&] {
        auto& expr = op.unwrapImplicitConversions();
        if (expr.kind == ExpressionKind::LValueReference)
            return true;

        return expr.kind == ExpressionKind::BinaryOp &&
               expr.as<BinaryExpression>().left().unwrapImplicitConversions().kind ==
                   ExpressionKind::LValueReference;
    };
    if (isCompoundAssign())
        return;

    const Type& lt = targetType.getCanonicalType();
    const Type& rt = sourceType.getCanonicalType();
    if (lt.isIntegral() && rt.isIntegral()) {
        // Warn for conversions between different enums/structs/unions.
        if (isStructUnionEnum(lt) && isStructUnionEnum(rt) && !lt.isMatching(rt)) {
            if (!isSameStructUnion(lt, rt) && !isUnionMemberType(lt, rt))
                addDiag(diag::ImplicitConvert) << sourceType << targetType;
            return;
        }

        // Warn for conversions between packed arrays of differing
        // dimension counts or sizes.
        if (isMultiDimArray(lt) && isMultiDimArray(rt) && !hasSameDims(lt, rt)) {
            // Avoid warning for assignments or comparisons with 0 or '0, '1.
            auto isZeroOrUnsized = [](const Expression& e) {
                auto expr = &e.unwrapImplicitConversions();
                if (expr->kind == ExpressionKind::ConditionalOp) {
                    if (auto known = expr->as<ConditionalExpression>().knownSide())
                        expr = known;
                }

                return expr->kind == ExpressionKind::UnbasedUnsizedIntegerLiteral ||
                       (expr->kind == ExpressionKind::IntegerLiteral &&
                        bool(expr->as<IntegerLiteral>().getValue() == 0));
            };

            if (!isZeroOrUnsized(op) &&
                (!parentIsComparison() ||
                 !isZeroOrUnsized(parentExpr->as<BinaryExpression>().right()))) {
                addDiag(diag::PackedArrayConv) << sourceType << targetType;
            }
        }

        // Check to rule out false positives: try to eval as a constant.
        // We'll ignore any constants, because they will get their own more
        // fine grained warning during eval.
        if (context.tryEval(op))
            return;

        // Warn for sign conversions.
        if (lt.isSigned() != rt.isSigned()) {
            // Comparisons get their own warning elsewhere.
            if (!parentIsComparison() && op.getEffectiveSign(/* isForConversion */ false) !=
                                             Expression::EffectiveSign::Either) {
                addDiag(diag::SignConversion) << sourceType << targetType;
            }
        }

        // Don't issue width warnings for propagated conversions, as they would
        // be extremely noisy and of dubious value (since they act the way people
        // expect their expressions to behave).
        if (conversionKind == ConversionKind::Propagated)
            return;

        // Warn for implicit assignments between integral types of differing widths.
        bitwidth_t targetWidth = lt.getBitWidth();
        bitwidth_t actualWidth = rt.getBitWidth();
        if (targetWidth == actualWidth)
            return;

        // Before we go and issue this warning, weed out false positives by
        // recomputing the width of the expression, with all constants sized
        // to the minimum width necessary to represent them. Otherwise, even
        // code as simple as this will result in a warning:
        //    logic [3:0] a = 1;
        std::optional<bitwidth_t> effective = op.getEffectiveWidth();
        if (!effective)
            return;

        // Now that we know the effective width, compare it to the expression's
        // actual width. We don't warn if the target is anywhere in between the
        // effective and the actual width.
        SLANG_ASSERT(effective <= actualWidth);
        if (targetWidth < effective || targetWidth > actualWidth) {
            DiagCode code;
            if (context.getInstance())
                code = targetWidth < effective ? diag::PortWidthTruncate : diag::PortWidthExpand;
            else
                code = targetWidth < effective ? diag::WidthTruncate : diag::WidthExpand;
            addDiag(code) << actualWidth << targetWidth;
        }
    }
    else if (lt.isNumeric() && rt.isNumeric()) {
        // Don't warn for constexprs.
        if (context.tryEval(op))
            return;

        DiagCode code;
        if (lt.isIntegral())
            code = diag::FloatIntConv;
        else if (rt.isIntegral())
            code = diag::IntFloatConv;
        else if (lt.getBitWidth() < rt.getBitWidth())
            code = diag::FloatNarrow;
        else if (lt.getBitWidth() > rt.getBitWidth())
            code = diag::FloatWiden;
        else
            return;

        addDiag(code) << sourceType << targetType;
    }
}